

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewChange.h
# Opt level: O0

void __thiscall
NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::WriteInIndexFile(NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fileName
                  ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fileHash)

{
  byte bVar1;
  char *__s;
  ostream *poVar2;
  Logger *pLVar3;
  allocator<char> local_2f9;
  string local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  allocator<char> local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  ostream local_220 [8];
  ofstream index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fileHash_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fileName_local;
  NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_local;
  
  __s = (char *)std::__cxx11::string::data();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,__s,&local_261);
  std::operator+(&local_240,&local_260,"/Index");
  std::ofstream::ofstream(local_220,(string *)&local_240,_S_app);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  poVar2 = std::operator<<(local_220,"add");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,(string *)fileHash);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,(string *)fileName);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    pLVar3 = Logger::getInstance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,"Can\'t create new line",&local_2f9);
    Logger::LogError(pLVar3,&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator(&local_2f9);
  }
  else {
    pLVar3 = Logger::getInstance();
    std::operator+(&local_2d8,"New line in Index file - add",fileHash);
    std::operator+(&local_2b8,&local_2d8," ");
    std::operator+(&local_298,&local_2b8,fileName);
    Logger::LogInformation(pLVar3,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2d8);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

virtual void WriteInIndexFile(T fileName, T fileHash) {
        ofstream index(string(this->path->data()) + "/Index", ios_base::app);

        index << "add" << " " << fileHash << " " << fileName << endl;

        if (index.is_open()) {
            Logger::getInstance()->LogInformation("New line in Index file - add" + fileHash + " " + fileName);
        } else {
            Logger::getInstance()->LogError("Can't create new line");
        }

        index.close();
    }